

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

Scene * red_blue(void)

{
  Point3 look_from;
  Point3 look_at;
  Scene *in_RDI;
  double r;
  ObjectList objects;
  Camera camera;
  undefined1 local_1b9;
  Sphere *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1b0 [2];
  double local_1a0;
  shared_ptr<Lambertian> local_198;
  value_type local_188;
  value_type local_178;
  undefined **local_168;
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> local_160;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Camera local_e8;
  
  local_168 = &PTR_hit_0010fb28;
  local_160.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_160.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_160.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0 = 0.7071067811865476;
  local_e8.origin_.e[0] = -0.7071067811865476;
  local_e8.origin_.e[1] = 0.0;
  local_e8.origin_.e[2] = -1.0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fb98;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fc10;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3ff00000;
  local_1b8 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,double&,std::shared_ptr<Lambertian>>
            (a_Stack_1b0,&local_1b8,(allocator<Sphere> *)&local_1b9,&local_e8.origin_,&local_1a0,
             &local_198);
  local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_1b8->super_Object
  ;
  local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1b0[0]._M_pi;
  local_1b8 = (Sphere *)0x0;
  a_Stack_1b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_160,&local_178);
  if (local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (a_Stack_1b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1b0[0]._M_pi);
  }
  if (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_e8.origin_.e[0] = local_1a0;
  local_e8.origin_.e[1] = 0.0;
  local_e8.origin_.e[2] = -1.0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fb98;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fc10;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3ff00000;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  local_1b8 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,double&,std::shared_ptr<Lambertian>>
            (a_Stack_1b0,&local_1b8,(allocator<Sphere> *)&local_1b9,&local_e8.origin_,&local_1a0,
             &local_198);
  local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_1b8->super_Object
  ;
  local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1b0[0]._M_pi;
  local_1b8 = (Sphere *)0x0;
  a_Stack_1b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_160,&local_188);
  if (local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (a_Stack_1b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1b0[0]._M_pi);
  }
  if (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0xbff0000000000000;
  local_148 = 0;
  uStack_144 = 0;
  uStack_140 = 0;
  uStack_13c = 0x3ff00000;
  local_138 = 0;
  look_from.e[2] = 0.0;
  look_from.e[0] = 0.0;
  look_from.e[1] = 0.0;
  look_at.e[2] = -1.0;
  look_at.e[0] = 0.0;
  look_at.e[1] = 0.0;
  Camera::Camera(&local_e8,look_from,look_at,(Vec3)(ZEXT824(0x3ff0000000000000) << 0x40),90.0,
                 1.7777777777777777,0.0,1.0);
  (in_RDI->objects_).super_Object._vptr_Object = (_func_int **)&PTR_hit_0010fb28;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::vector
            (&(in_RDI->objects_).objects_,&local_160);
  memcpy(&in_RDI->camera_,&local_e8,0xb0);
  local_168 = &PTR_hit_0010fb28;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::~vector
            (&local_160);
  return in_RDI;
}

Assistant:

Scene red_blue() {
  ObjectList objects;

  double r = cos(PI/4);
  objects.add(std::make_shared<Sphere>(Point3(-r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(0,0,1))));
  objects.add(std::make_shared<Sphere>(Point3(r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(1, 0, 0))));

  // Setup camera
  Point3 camera_position{0, 0, 0};
  Point3 camera_target{0, 0, -1};
  double field_of_view = 90;
  double aperture = 0.0; // no defocus blur

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                (camera_position - camera_target).length());

  return {objects, camera};
}